

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O3

void * readline_stdin(void *arg)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  void *__dest;
  int iVar4;
  char tmp [1024];
  char acStack_438 [1032];
  
  iVar1 = feof(_stdin);
  if (iVar1 == 0) {
    do {
      pcVar2 = fgets(acStack_438,0x400,_stdin);
      if (pcVar2 == (char *)0x0) {
LAB_00121ca7:
        exit(1);
      }
      sVar3 = strlen(acStack_438);
      __dest = malloc((long)(int)sVar3);
      sVar3 = (size_t)((int)sVar3 + -1);
      memcpy(__dest,acStack_438,sVar3);
      *(undefined1 *)((long)__dest + sVar3) = 0;
      pthread_mutex_lock((pthread_mutex_t *)arg);
      iVar1 = *(int *)((long)arg + 0x2c);
      iVar4 = iVar1 + 1;
      if (0x3fe < (long)iVar1) {
        iVar4 = 0;
      }
      *(void **)((long)arg + (long)iVar1 * 8 + 0x30) = __dest;
      *(int *)((long)arg + 0x2c) = iVar4;
      if (*(int *)((long)arg + 0x28) == iVar4) goto LAB_00121ca7;
      pthread_mutex_unlock((pthread_mutex_t *)arg);
      iVar1 = feof(_stdin);
    } while (iVar1 == 0);
  }
  return (void *)0x0;
}

Assistant:

static void *
readline_stdin(void * arg) {
	struct queue * q = arg;
	char tmp[1024];
	while (!feof(stdin)) {
		if (fgets(tmp,sizeof(tmp),stdin) == NULL) {
			// read stdin failed
			exit(1);
		}
		int n = strlen(tmp) -1;

		char * str = malloc(n+1);
		memcpy(str, tmp, n);
		str[n] = 0;

		pthread_mutex_lock(&q->lock);
		q->queue[q->tail] = str;

		if (++q->tail >= QUEUE_SIZE) {
			q->tail = 0;
		}
		if (q->head == q->tail) {
			// queue overflow
			exit(1);
		}
		pthread_mutex_unlock(&q->lock);
	}
	return NULL;
}